

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

void __thiscall duckdb::Relation::Insert(Relation *this,string *table_name)

{
  allocator local_39;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,anon_var_dwarf_3b2a81b + 9,&local_39);
  Insert(this,&local_38,table_name);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Relation::Insert(const string &table_name) {
	Insert(INVALID_SCHEMA, table_name);
}